

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O0

HTMLElement * __thiscall
soul::HTMLGenerator::createNav(HTMLElement *__return_storage_ptr__,HTMLGenerator *this)

{
  HTMLElement *this_00;
  TableOfContentsNode local_c0;
  string_view local_78;
  string_view local_68 [2];
  allocator<char> local_41;
  string local_40;
  undefined1 local_19;
  HTMLGenerator *local_18;
  HTMLGenerator *this_local;
  HTMLElement *nav;
  
  local_19 = 0;
  local_18 = this;
  this_local = (HTMLGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"nav",&local_41);
  choc::html::HTMLElement::HTMLElement(__return_storage_ptr__,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_68,"contents");
  this_00 = choc::html::HTMLElement::setID(__return_storage_ptr__,local_68[0]);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,"contents");
  choc::html::HTMLElement::setClass(this_00,local_78);
  SourceCodeModel::createTableOfContentsRoot(&local_c0,&this->model);
  printTOCNode(this,__return_storage_ptr__,&local_c0,true);
  SourceCodeModel::TableOfContentsNode::~TableOfContentsNode(&local_c0);
  return __return_storage_ptr__;
}

Assistant:

choc::html::HTMLElement createNav()
    {
        choc::html::HTMLElement nav ("nav");
        nav.setID ("contents").setClass ("contents");
        printTOCNode (nav, model.createTableOfContentsRoot(), true);
        return nav;
    }